

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O1

void __thiscall
SQCompilation::CheckerVisitor::speculateIfConditionHeuristics
          (CheckerVisitor *this,Expr *cond,VarScope *thenScope,VarScope *elseScope,
          unordered_set<const_SQCompilation::Expr_*,_std::hash<const_SQCompilation::Expr_*>,_std::equal_to<const_SQCompilation::Expr_*>,_std::allocator<const_SQCompilation::Expr_*>_>
          *visited,int32_t evalId,uint flags,bool inv)

{
  _Hash_node_base *p_Var1;
  long lVar2;
  int iVar3;
  Expr *pEVar4;
  Expr *pEVar5;
  Id *pIVar6;
  Expr *pEVar7;
  Id *lvalue;
  Id *pIVar8;
  VarScope *pVVar9;
  undefined4 extraout_var_00;
  uint pf;
  Expr *pEVar10;
  uint nf;
  ulong uVar11;
  bool bVar12;
  __node_base_ptr p_Var13;
  __node_base_ptr p_Var14;
  TreeOp op;
  long lVar15;
  VarScope *pVVar16;
  byte bVar17;
  ulong uVar18;
  Expr *cond_local;
  VarScope *local_60;
  undefined8 local_58;
  Expr *local_50;
  LiteralExpr *typeLit;
  Expr *typeCheckee;
  Expr *nullcCheckee;
  undefined4 extraout_var;
  
  cond_local = cond;
  cond_local = deparen(cond);
  uVar18 = (visited->_M_h)._M_bucket_count;
  uVar11 = (ulong)cond_local % uVar18;
  p_Var13 = (visited->_M_h)._M_buckets[uVar11];
  p_Var14 = (__node_base_ptr)0x0;
  if ((p_Var13 != (__node_base_ptr)0x0) &&
     (p_Var1 = p_Var13->_M_nxt, p_Var14 = p_Var13, cond_local != (Expr *)p_Var13->_M_nxt[1]._M_nxt))
  {
    while (p_Var13 = p_Var1, p_Var1 = p_Var13->_M_nxt, p_Var1 != (_Hash_node_base *)0x0) {
      p_Var14 = (__node_base_ptr)0x0;
      if (((ulong)p_Var1[1]._M_nxt % uVar18 != uVar11) ||
         (p_Var14 = p_Var13, cond_local == (Expr *)p_Var1[1]._M_nxt)) goto LAB_00156bc6;
    }
    p_Var14 = (__node_base_ptr)0x0;
  }
LAB_00156bc6:
  if ((p_Var14 != (__node_base_ptr)0x0) && (p_Var14->_M_nxt != (_Hash_node_base *)0x0)) {
    return;
  }
  std::
  _Hashtable<SQCompilation::Expr_const*,SQCompilation::Expr_const*,std::allocator<SQCompilation::Expr_const*>,std::__detail::_Identity,std::equal_to<SQCompilation::Expr_const*>,std::hash<SQCompilation::Expr_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_M_emplace<SQCompilation::Expr_const*&>
            ((_Hashtable<SQCompilation::Expr_const*,SQCompilation::Expr_const*,std::allocator<SQCompilation::Expr_const*>,std::__detail::_Identity,std::equal_to<SQCompilation::Expr_const*>,std::hash<SQCompilation::Expr_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)visited,&cond_local);
  op = (cond_local->super_Node)._op;
  local_60 = this->currentScope;
  if (op == TO_OROR) {
    inv = !inv;
    op = TO_ANDAND;
    local_58 = (VarScope *)CONCAT44(local_58._4_4_,(int)CONCAT71((int7)((ulong)local_60 >> 8),1));
  }
  else {
    if (op == TO_NE) {
      inv = !inv;
      op = TO_EQ;
    }
    else if (op == TO_NOT) {
      pEVar5 = (Expr *)cond_local[1].super_Node.super_ArenaObj._vptr_ArenaObj;
      bVar12 = !inv;
      goto LAB_00156c3a;
    }
    local_58 = (VarScope *)((ulong)local_58._4_4_ << 0x20);
  }
  pVVar16 = thenScope;
  pVVar9 = elseScope;
  if (inv != false) {
    pVVar16 = elseScope;
    pVVar9 = thenScope;
  }
  thenScope = pVVar9;
  nullcCheckee = (Expr *)0x0;
  bVar12 = detectNullCPattern(this,op,cond_local,&nullcCheckee);
  pEVar5 = cond_local;
  if (bVar12) {
    pIVar6 = (Id *)nullcCheckee;
    if (((op & ~TO_WHILE) == TO_GE) || (op == TO_EQ)) {
      if (thenScope == (VarScope *)0x0) goto LAB_00156da6;
      this->currentScope = thenScope;
    }
    else {
      if (pVVar16 == (VarScope *)0x0) goto LAB_00156da6;
      this->currentScope = pVVar16;
    }
LAB_00156d9a:
    nf = 0;
    pf = 2;
  }
  else {
    if (op != TO_NULLC) {
      if (pVVar16 == (VarScope *)0x0 || (op != TO_CALL || evalId != -1)) {
        if (op == TO_ID) {
          local_58 = (VarScope *)CONCAT71(local_58._1_7_,evalId != -1);
          typeLit = (LiteralExpr *)CONCAT44(typeLit._4_4_,0xffffffff);
          pEVar5 = maybeEval(this,cond_local,(int32_t *)&typeLit,false);
          local_50 = (Expr *)CONCAT44(local_50._4_4_,(int)typeLit);
          bVar17 = evalId <= (int)typeLit & (byte)local_58;
          if (pVVar16 != (VarScope *)0x0 && bVar17 == 0) {
            this->currentScope = pVVar16;
            setValueFlags(this,cond_local,0,2);
            this->currentScope = local_60;
          }
          if (((flags & 1) != 0) && (thenScope != (VarScope *)0x0 && bVar17 == 0)) {
            this->currentScope = thenScope;
            setValueFlags(this,cond_local,2,0);
            this->currentScope = local_60;
          }
          if (pEVar5 == cond_local) {
            return;
          }
          bVar12 = false;
          elseScope = thenScope;
          thenScope = pVVar16;
          evalId = (int32_t)local_50;
LAB_00156c3a:
          speculateIfConditionHeuristics
                    (this,pEVar5,thenScope,elseScope,visited,evalId,flags,bVar12);
          return;
        }
        if (op == TO_EQ) {
          local_50 = cond_local;
          pEVar5 = deparen((Expr *)cond_local[1].super_Node.super_ArenaObj._vptr_ArenaObj);
          pEVar7 = deparen(*(Expr **)&local_50[1].super_Node._coordinates);
          pEVar4 = (Expr *)0x0;
          if ((pEVar5->super_Node)._op == TO_LITERAL) {
            pEVar4 = pEVar5;
          }
          pEVar10 = (Expr *)0x0;
          if ((pEVar7->super_Node)._op == TO_LITERAL) {
            pEVar10 = pEVar7;
          }
          if (pEVar4 != (Expr *)0x0) {
            pEVar10 = pEVar4;
          }
          if (pEVar10 == pEVar5) {
            pEVar5 = pEVar7;
          }
          if (pEVar10 == (Expr *)0x0) {
            return;
          }
          if (*(int *)&(pEVar10->super_Node).field_0x1c == 4) {
            flags = flags | 1;
            bVar12 = false;
            elseScope = pVVar16;
            goto LAB_00156c3a;
          }
          pIVar6 = extractReceiver(pEVar5);
          if ((pVVar16 != (VarScope *)0x0) && (pIVar6 != (Id *)0x0)) {
            this->currentScope = pVVar16;
            setValueFlags(this,&pIVar6->super_Expr,0,2);
            this->currentScope = local_60;
          }
LAB_00157061:
          pEVar5 = cond_local;
          if (op - TO_3CMP < 5) {
            lvalue = (Id *)deparen((Expr *)cond_local[1].super_Node.super_ArenaObj._vptr_ArenaObj);
            pIVar8 = (Id *)deparen(*(Expr **)&pEVar5[1].super_Node._coordinates);
            if ((lvalue->super_Expr).super_Node._op != TO_ID) {
              lvalue = (Id *)0x0;
            }
            pIVar6 = (Id *)0x0;
            if ((pIVar8->super_Expr).super_Node._op == TO_ID) {
              pIVar6 = pIVar8;
            }
            if (pVVar16 == (VarScope *)0x0) {
              return;
            }
            this->currentScope = pVVar16;
            if (lvalue != (Id *)0x0) {
              setValueFlags(this,&lvalue->super_Expr,0,2);
            }
            goto joined_r0x001570c0;
          }
          typeLit = (LiteralExpr *)0x0;
          typeCheckee = (Expr *)0x0;
          bVar12 = detectTypeOfPattern(this,cond_local,&typeCheckee,&typeLit);
          pEVar5 = typeCheckee;
          if (bVar12) {
            pIVar6 = extractReceiver(typeCheckee);
            if (pIVar6 == (Id *)0x0) {
              return;
            }
            iVar3 = strcmp((typeLit->_v).s,"null");
            if (pVVar16 != (VarScope *)0x0) {
              this->currentScope = pVVar16;
              setValueFlags(this,&pIVar6->super_Expr,
                            (uint)((Id *)pEVar5 == pIVar6 && iVar3 == 0) * 2,(uint)(iVar3 != 0) * 2)
              ;
            }
            if (thenScope == (VarScope *)0x0) goto LAB_00156da6;
            pf = (uint)(iVar3 == 0) * 2;
            this->currentScope = thenScope;
            nf = 0;
            goto LAB_00156da1;
          }
          if (op == TO_ANDAND) {
            pEVar5 = (Expr *)cond_local[1].super_Node.super_ArenaObj._vptr_ArenaObj;
            local_50 = *(Expr **)&cond_local[1].super_Node._coordinates;
            if (thenScope == (VarScope *)0x0) {
              pVVar9 = (VarScope *)0x0;
              local_60 = (VarScope *)0x0;
            }
            else {
              iVar3 = VarScope::copy(thenScope,(EVP_PKEY_CTX *)this->arena,(EVP_PKEY_CTX *)0x0);
              pVVar9 = (VarScope *)CONCAT44(extraout_var,iVar3);
              iVar3 = VarScope::copy(thenScope,(EVP_PKEY_CTX *)this->arena,(EVP_PKEY_CTX *)0x0);
              local_60 = (VarScope *)CONCAT44(extraout_var_00,iVar3);
            }
            bVar12 = SUB81(local_58,0);
            local_58 = pVVar9;
            speculateIfConditionHeuristics(this,pEVar5,pVVar16,pVVar9,visited,evalId,flags,bVar12);
            pVVar9 = local_60;
            speculateIfConditionHeuristics
                      (this,local_50,pVVar16,local_60,visited,evalId,flags,bVar12);
            pVVar16 = local_58;
            if (thenScope == (VarScope *)0x0) {
              return;
            }
            VarScope::intersectScopes(local_58,pVVar9);
            VarScope::copyFrom(thenScope,pVVar16);
            VarScope::~VarScope(pVVar16);
            VarScope::~VarScope(pVVar9);
            return;
          }
          if (1 < op - TO_IN) {
            return;
          }
          pEVar5 = *(Expr **)&cond_local[1].super_Node._coordinates;
          pIVar6 = extractReceiver((Expr *)cond_local[1].super_Node.super_ArenaObj._vptr_ArenaObj);
          if ((pVVar16 != (VarScope *)0x0) && (pIVar6 != (Id *)0x0)) {
            this->currentScope = pVVar16;
            setValueFlags(this,&pIVar6->super_Expr,0,2);
          }
          if (((op != TO_IN) || (pIVar6 = extractReceiver(pEVar5), pVVar16 == (VarScope *)0x0)) ||
             (pIVar6 == (Id *)0x0)) goto LAB_00156da6;
        }
        else {
          if ((op != TO_GETSLOT) && (op != TO_GETFIELD)) goto LAB_00157061;
          pEVar4 = deparen((Expr *)cond_local[1].super_Node.super_ArenaObj._vptr_ArenaObj);
          pIVar6 = extractReceiver(pEVar4);
          if ((pVVar16 != (VarScope *)0x0) && (pIVar6 != (Id *)0x0)) {
            this->currentScope = pVVar16;
            setValueFlags(this,&pIVar6->super_Expr,0,2);
          }
          if (pVVar16 == (VarScope *)0x0 || op != TO_GETSLOT) goto LAB_00156da6;
          pIVar6 = (Id *)deparen(*(Expr **)&pEVar5[1].super_Node._coordinates.lineEnd);
        }
        this->currentScope = pVVar16;
      }
      else {
        this->currentScope = pVVar16;
        uVar18 = (ulong)cond_local[1].super_Node._op;
        if (uVar18 != 0) {
          lVar2 = *(long *)&cond_local[1].super_Node._coordinates.lineEnd;
          lVar15 = 0;
          do {
            pEVar4 = deparen(*(Expr **)(lVar2 + lVar15));
            if ((pEVar4->super_Node)._op == TO_ID) {
              setValueFlags(this,pEVar4,0,2);
            }
            lVar15 = lVar15 + 8;
          } while (uVar18 << 3 != lVar15);
        }
        pIVar6 = extractReceiver((Expr *)pEVar5[1].super_Node.super_ArenaObj._vptr_ArenaObj);
joined_r0x001570c0:
        if (pIVar6 == (Id *)0x0) goto LAB_00156da6;
      }
      goto LAB_00156d9a;
    }
    pEVar4 = deparen((Expr *)cond_local[1].super_Node.super_ArenaObj._vptr_ArenaObj);
    pEVar5 = deparen(*(Expr **)&pEVar5[1].super_Node._coordinates);
    if ((pEVar5->super_Node)._op != TO_LITERAL) {
      return;
    }
    switch(*(undefined4 *)&(pEVar5->super_Node).field_0x1c) {
    case 0:
      bVar17 = 1;
      break;
    case 1:
      bVar17 = pEVar5[1].super_Node.super_ArenaObj._vptr_ArenaObj != (_func_int **)0x0;
      break;
    case 2:
      bVar17 = -(*(float *)&pEVar5[1].super_Node.super_ArenaObj._vptr_ArenaObj != 0.0) & 1;
      break;
    case 3:
      bVar17 = *(byte *)&pEVar5[1].super_Node.super_ArenaObj._vptr_ArenaObj;
      break;
    default:
      bVar17 = 0;
    }
    pIVar6 = extractReceiver(pEVar4);
    if (pIVar6 == (Id *)0x0) {
      return;
    }
    nf = (uint)(bVar17 ^ 1) * 2;
    pf = (uint)bVar17 * 2;
    if (bVar17 == 0 && pVVar16 != (VarScope *)0x0) {
      this->currentScope = pVVar16;
      setValueFlags(this,&pIVar6->super_Expr,pf,nf);
    }
    if (thenScope == (VarScope *)0x0 || (bVar17 ^ 1) != 0) goto LAB_00156da6;
    this->currentScope = thenScope;
  }
LAB_00156da1:
  setValueFlags(this,&pIVar6->super_Expr,nf,pf);
LAB_00156da6:
  this->currentScope = local_60;
  return;
}

Assistant:

void CheckerVisitor::speculateIfConditionHeuristics(const Expr *cond, VarScope *thenScope, VarScope *elseScope, std::unordered_set<const Expr *> &visited, int32_t evalId, unsigned flags, bool inv) {
  cond = deparen(cond);

  if (visited.find(cond) != visited.end()) {
    return;
  }

  visited.emplace(cond);

  enum TreeOp op = cond->op();

  VarScope *thisScope = currentScope;

  if (op == TO_NOT) {
    const UnExpr *u = static_cast<const UnExpr *>(cond);
    return speculateIfConditionHeuristics(u->argument(), thenScope, elseScope, visited, evalId, flags, !inv);
  }

  bool invertLR = false;
  if (op == TO_NE) {
    op = TO_EQ;
    inv = !inv;
  } else if (op == TO_OROR) {
    // apply a || b <==> !(!a && !b)
    op = TO_ANDAND;
    invertLR = true;
    inv = !inv;
  }

  if (inv) {
    std::swap(thenScope, elseScope);
  }

  const Expr *nullcCheckee = nullptr;
  if (detectNullCPattern(op, cond, nullcCheckee)) {
    // (o?.f ?? D) == V -- assume else-branch implies `o` non-null
    // (o?.f ?? D) > V -- then-b implies `o` non-null
    // (o?.f ?? D) < V -- then-b implies `o` non-null

    if (op == TO_LE || op == TO_GE) {
      if (elseScope) {
        currentScope = elseScope;
        setValueFlags(nullcCheckee, 0, RT_NULL);
      }
    } else if (op == TO_EQ) {
      if (elseScope) {
        currentScope = elseScope;
        setValueFlags(nullcCheckee, 0, RT_NULL);
      }
    }
    else {
      assert(op == TO_LT || op == TO_GT);
      if (thenScope) {
        currentScope = thenScope;
        setValueFlags(nullcCheckee, 0, RT_NULL);
      }
    }

    currentScope = thisScope; // -V519
    return;
  }

  if (op == TO_NULLC) {
    // o?.f ?? false
    // o?.f ?? true
    const BinExpr *bin = cond->asBinExpr();
    const Expr *lhs = deparen(bin->lhs());
    const Expr *rhs = deparen(bin->rhs());

    if (rhs->op() != TO_LITERAL) { // -V522
      return;
    }

    const LiteralExpr *lit = rhs->asLiteral();
    bool nullCond;
    switch (lit->kind())
    {
    case LK_BOOL:
      nullCond = rhs->asLiteral()->b();
      break;
    case LK_NULL:
      nullCond = false;
      break;
    case LK_INT:
      nullCond = lit->i() != 0;
      break;
    case LK_FLOAT:
      nullCond = lit->f() != 0.0f;
      break;
    case LK_STRING:
      nullCond = true;
      break;
    default:
      assert(0 && "unknown literal kind");
      break;
    }

    unsigned pf, nf;

    if (nullCond) {
      pf = RT_NULL;
      nf = 0;
    }
    else {
      pf = 0;
      nf = RT_NULL;
    }

    const Expr *receiver = extractReceiver(lhs);

    if (!receiver)
      return;

    if (thenScope && !nullCond) {
      currentScope = thenScope;
      setValueFlags(receiver, pf, nf);
    }

    if (elseScope && nullCond) {
      currentScope = elseScope;
      setValueFlags(receiver, nf, pf); // -V764
    }

    currentScope = thisScope; // -V519

    return;
  }

  if (evalId == -1 && op == TO_CALL && thenScope) {
    // if condition looks like `if (foo(x)) x.bar()` consider call as null check
    currentScope = thenScope;
    const CallExpr *call = cond->asCallExpr();
    for (auto parg : call->arguments()) {
      auto arg = deparen(parg);
      if (arg->op() == TO_ID) { // -V522
        setValueFlags(arg, 0, RT_NULL);
      }
    }

    const Expr *callee = extractReceiver(call->callee());
    if (callee) {
      setValueFlags(callee, 0, RT_NULL);
    }

    currentScope = thisScope; // -V519
    return;
  }

  if (op == TO_ID) {
    int32_t evalIndex = -1;
    const Expr *eval = maybeEval(cond, evalIndex);

    bool notOverriden = evalId == -1 || evalIndex < evalId;

    if (thenScope && notOverriden) {
      // set iff it was explicit check like `if (o) { .. }`
      // otherwise there could be complexities, see intersected_assignment.nut
      currentScope = thenScope;
      setValueFlags(cond, 0, RT_NULL);
      currentScope = thisScope;
    }

    if (elseScope && notOverriden && (flags & NULL_CHECK_F)) {
      // set NULL iff it was explicit null check `if (o == null) { ... }` otherwise it could not be null, see w233_inc_in_for.nut
      currentScope = elseScope;
      setValueFlags(cond, RT_NULL, 0);
      currentScope = thisScope;
    }

    if (eval != cond) {
      // let cond = x != null
      // if (cond) { ... }
      speculateIfConditionHeuristics(eval, thenScope, elseScope, visited, evalIndex, flags, false);
    }
    return;
  }

  if (op == TO_GETSLOT || op == TO_GETFIELD) {
    // x?[y]
    const AccessExpr *acc = static_cast<const AccessExpr *>(cond);
    const Expr *reciever = extractReceiver(deparen(acc->receiver()));

    if (reciever && thenScope) {
      currentScope = thenScope;
      setValueFlags(reciever, 0, RT_NULL);
    }

    if (op == TO_GETSLOT) {
      const Expr *key = deparen(acc->asGetSlot()->key());
      if (thenScope) {
        currentScope = thenScope;
        setValueFlags(key, 0, RT_NULL);
      }
    }

    currentScope = thisScope; // -V519

    return;
  }

  if (op == TO_EQ) {
    const BinExpr *bin = cond->asBinExpr();
    const Expr *lhs = deparen(bin->lhs());
    const Expr *rhs = deparen(bin->rhs());

    const LiteralExpr *lhs_lit = lhs->op() == TO_LITERAL ? lhs->asLiteral() : nullptr; // -V522
    const LiteralExpr *rhs_lit = rhs->op() == TO_LITERAL ? rhs->asLiteral() : nullptr; // -V522

    const LiteralExpr *lit = lhs_lit ? lhs_lit : rhs_lit;
    const Expr *testee = lit == lhs ? rhs : lhs;

    if (!lit)
      return;

    if (lit->kind() == LK_NULL) {
      speculateIfConditionHeuristics(testee, elseScope, thenScope, visited, evalId, flags | NULL_CHECK_F, false);
      return;
    }

    const Expr *receiver = extractReceiver(testee);

    if (receiver && thenScope) {
      currentScope = thenScope;
      setValueFlags(receiver, 0, RT_NULL);
      currentScope = thisScope;
    }

  }

  if (isRelationOperator(op)) {
    const BinExpr *bin = cond->asBinExpr();
    const Expr *lhs = deparen(bin->lhs());
    const Expr *rhs = deparen(bin->rhs());

    const Id *lhs_id = lhs->op() == TO_ID ? lhs->asId() : nullptr; // -V522
    const Id *rhs_id = rhs->op() == TO_ID ? rhs->asId() : nullptr; // -V522

    if (thenScope) {
      currentScope = thenScope;
      if (lhs_id) {
        setValueFlags(lhs_id, 0, RT_NULL);
      }
      if (rhs_id) {
        setValueFlags(rhs_id, 0, RT_NULL);
      }
      currentScope = thisScope;
    }
    return;
  }

  const LiteralExpr *typeLit = nullptr;
  const Expr *typeCheckee = nullptr;

  if (detectTypeOfPattern(cond, typeCheckee, typeLit)) {
    assert(typeCheckee && typeLit);

    const Id *checkeeId = extractReceiver(typeCheckee);
    if (!checkeeId)
      return;

    bool nullCheck = strcmp(typeLit->s(), _SC("null")) == 0; // todo: should it be more precise in case of avaliable names
    bool accessCheck = typeCheckee != checkeeId;

    // if it's null check we could know for sure that true-branch implies NULL and false-branch implies NON_NULL
    // if it's not a null check we could only guarantee that true-branch implies NON_NULL
    unsigned pt = 0, nt = 0, pe = 0, ne = 0;

    if (nullCheck) {
      if (accessCheck) {
        ne = RT_NULL;
      }
      else {
        pt = RT_NULL;
        ne = RT_NULL;
      }
    }
    else {
      nt = RT_NULL;
    }

    if (thenScope) {
      currentScope = thenScope;
      setValueFlags(checkeeId, pt, nt);
    }
    if (elseScope) {
      currentScope = elseScope;
      setValueFlags(checkeeId, pe, ne);
    }

    currentScope = thisScope; // -V519

    return;
  }

  if (op == TO_ANDAND) {
    const BinExpr *bin = cond->asBinExpr();
    const Expr *lhs = bin->lhs();
    const Expr *rhs = bin->rhs();

    VarScope *lhsEScope = nullptr;
    VarScope *rhsEScope = nullptr;

    // In '&&' operator all effects of the left-hand side work for the right side as well
    if (elseScope) {
      lhsEScope = elseScope->copy(arena);
      rhsEScope = elseScope->copy(arena);
    }

    speculateIfConditionHeuristics(lhs, thenScope, lhsEScope, visited, evalId, flags, invertLR);
    speculateIfConditionHeuristics(rhs, thenScope, rhsEScope, visited, evalId, flags, invertLR);

    if (elseScope) {
      // In contrast in `false`-branch there is no such integral effect, all we could say is something common of both side so
      // to compute that `common` part intersect lhs with rhs
      lhsEScope->intersectScopes(rhsEScope); // -V522
      elseScope->copyFrom(lhsEScope);

      lhsEScope->~VarScope();
      rhsEScope->~VarScope();
    }

    return;
  }

  if (op == TO_INSTANCEOF || op == TO_IN) {
    const BinExpr *bin = cond->asBinExpr();
    const Expr *lhs = bin->lhs();
    const Expr *rhs = bin->rhs();

    const Expr *checkee = extractReceiver(lhs);

    if (checkee && thenScope) {
      currentScope = thenScope;
      setValueFlags(checkee, 0, RT_NULL);
    }

    if (op == TO_IN) {
      checkee = extractReceiver(rhs);
      if (checkee && thenScope) {
        currentScope = thenScope;
        setValueFlags(checkee, 0, RT_NULL);
      }
    }

    currentScope = thisScope; // -V519

    return;
  }
}